

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldh_join_ti_impl.h
# Opt level: O2

void __thiscall
join::
LDHJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
::retrieve_candidates
          (LDHJoinTI<label::StringLabel,_ted::TouzetBaselineTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexTouzetBaseline>_>
           *this,vector<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::allocator<std::pair<int,_std::unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>_>_>_>
                 *histogram_collection,
          vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *candidates,
          double distance_threshold)

{
  CandidateIndex c_index;
  CandidateIndex local_28;
  
  local_28.pre_candidates_ = 0;
  local_28.il_lookups_ = 0;
  ldh_candidate_index::CandidateIndex::lookup
            (&local_28,histogram_collection,candidates,(int)this->il_size_,distance_threshold);
  this->pre_candidates_ = local_28.pre_candidates_;
  this->il_lookups_ = local_28.il_lookups_;
  return;
}

Assistant:

void LDHJoinTI<Label, VerificationAlgorithm>::retrieve_candidates(
    std::vector<std::pair<int, std::unordered_map<int, int>>>& histogram_collection,
    std::vector<std::pair<int, int>>& candidates,
    const double distance_threshold) {

  // Initialize candidate index.
  ldh_candidate_index::CandidateIndex c_index;

  // Retrieve candidates from the candidate index.
  c_index.lookup(histogram_collection, candidates, il_size_, distance_threshold);

  // Copy the number of pre-candidates.
  pre_candidates_ = c_index.get_number_of_pre_candidates();
  // Copy the number of inverted list lookups.
  il_lookups_ = c_index.get_number_of_il_lookups();
}